

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O0

void __thiscall jaegertracing::Span::setSamplingPriority(Span *this,Value *value)

{
  byte flags;
  TraceID *traceID;
  uint64_t spanID;
  uint64_t parentID;
  StrMap *baggage;
  string *debugID;
  SpanContext local_f0;
  byte local_29;
  uchar newFlags;
  lock_guard<std::mutex> lock;
  bool priority;
  SamplingPriorityVisitor visitor;
  Value *value_local;
  Span *this_local;
  
  lock._M_device._6_1_ =
       opentracing::v3::util::
       variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
       ::
       visit<jaegertracing::(anonymous_namespace)::SamplingPriorityVisitor&,opentracing::v3::Value,bool>
                 (value,(SamplingPriorityVisitor *)((long)&lock._M_device + 7));
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->_mutex);
  local_29 = SpanContext::flags(&this->_context);
  if ((lock._M_device._6_1_ & 1) == 0) {
    local_29 = local_29 & 0xfe;
  }
  else {
    local_29 = local_29 | 3;
  }
  traceID = SpanContext::traceID(&this->_context);
  spanID = SpanContext::spanID(&this->_context);
  parentID = SpanContext::parentID(&this->_context);
  flags = local_29;
  baggage = SpanContext::baggage_abi_cxx11_(&this->_context);
  debugID = SpanContext::debugID_abi_cxx11_(&this->_context);
  SpanContext::SpanContext(&local_f0,traceID,spanID,parentID,flags,baggage,debugID);
  SpanContext::operator=(&this->_context,&local_f0);
  SpanContext::~SpanContext(&local_f0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void Span::setSamplingPriority(const opentracing::Value& value)
{
    SamplingPriorityVisitor visitor;
    const auto priority = opentracing::Value::visit(value, visitor);

    std::lock_guard<std::mutex> lock(_mutex);
    auto newFlags = _context.flags();
    if (priority) {
        newFlags |= static_cast<unsigned char>(SpanContext::Flag::kSampled) |
                    static_cast<unsigned char>(SpanContext::Flag::kDebug);
    }
    else {
        newFlags &= ~static_cast<unsigned char>(SpanContext::Flag::kSampled);
    }

    _context = SpanContext(_context.traceID(),
                           _context.spanID(),
                           _context.parentID(),
                           newFlags,
                           _context.baggage(),
                           _context.debugID());
}